

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O2

void __thiscall Rml::DecoratorTextInstancer::DecoratorTextInstancer(DecoratorTextInstancer *this)

{
  EffectSpecification *this_00;
  PropertyId PVar1;
  PropertyDefinition *pPVar2;
  allocator<char> local_de;
  allocator<char> local_dd;
  allocator<char> local_dc;
  allocator<char> local_db;
  allocator<char> local_da;
  allocator<char> local_d9;
  String local_d8;
  String local_b8;
  String local_98;
  String local_78;
  String local_58;
  String local_38;
  
  DecoratorInstancer::DecoratorInstancer(&this->super_DecoratorInstancer);
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorTextInstancer_003970c8;
  (this->ids).text = Invalid;
  (this->ids).color = Invalid;
  (this->ids).align_x = Invalid;
  (this->ids).align_y = Invalid;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"text",(allocator<char> *)&local_38);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"",(allocator<char> *)&local_58);
  this_00 = &(this->super_DecoratorInstancer).super_EffectSpecification;
  pPVar2 = EffectSpecification::RegisterProperty(this_00,&local_b8,&local_d8);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"string",&local_dd);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_de);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_78,&local_98);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).text = PVar1;
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"color",&local_dd);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"inherit-color",&local_de);
  pPVar2 = EffectSpecification::RegisterProperty(this_00,&local_b8,&local_d8);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"keyword",&local_d9);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"inherit-color",&local_da);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_78,&local_98);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"color",&local_db);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_dc);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_38,&local_58);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).color = PVar1;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"align-x",&local_dd);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"center",&local_de);
  pPVar2 = EffectSpecification::RegisterProperty(this_00,&local_b8,&local_d8);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"keyword",&local_d9);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"left, center, right",&local_da);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_78,&local_98);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"length_percent",&local_db);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_dc);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_38,&local_58);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).align_x = PVar1;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"align-y",&local_dd);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"center",&local_de);
  pPVar2 = EffectSpecification::RegisterProperty(this_00,&local_b8,&local_d8);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"keyword",&local_d9);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"top, center, bottom",&local_da);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_78,&local_98);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"length_percent",&local_db);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_dc);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_38,&local_58);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).align_y = PVar1;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"decorator",(allocator<char> *)&local_78);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"text, color, align-x, align-y, align-x",
             (allocator<char> *)&local_98);
  EffectSpecification::RegisterShorthand(this_00,&local_b8,&local_d8,FallThrough);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

DecoratorTextInstancer::DecoratorTextInstancer()
{
	ids = {};
	ids.text = RegisterProperty("text", "").AddParser("string").GetId();
	ids.color = RegisterProperty("color", "inherit-color").AddParser("keyword", "inherit-color").AddParser("color").GetId();
	ids.align_x = RegisterProperty("align-x", "center").AddParser("keyword", "left, center, right").AddParser("length_percent").GetId();
	ids.align_y = RegisterProperty("align-y", "center").AddParser("keyword", "top, center, bottom").AddParser("length_percent").GetId();

	RegisterShorthand("decorator", "text, color, align-x, align-y, align-x", ShorthandType::FallThrough);
}